

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

void Ifn_NtkParseConstraints(char *pStr,Ifn_Ntk_t *p)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  p->nConstr = 0;
  iVar3 = 0;
  do {
    if (p->nInps <= iVar3) {
      return;
    }
    for (pcVar4 = pStr; *pcVar4 != '\0'; pcVar4 = pcVar4 + 1) {
      if ((iVar3 + 0x41 == (int)*pcVar4) && (pcVar4[-1] == ';')) {
        iVar2 = p->nConstr;
        if (0x78 < (long)iVar2) {
          __assert_fail("p->nConstr < IFN_INS*IFN_INS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                        ,0x1b0,"void Ifn_NtkParseConstraints(char *, Ifn_Ntk_t *)");
        }
        cVar1 = pcVar4[1];
        p->nConstr = iVar2 + 1;
        p->pConstr[iVar2] = (int)cVar1 - 0x41U | (iVar3 + 0x41) * 0x10000 - 0x410000U;
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Ifn_NtkParseConstraints( char * pStr, Ifn_Ntk_t * p )
{
    int i, k;
    // parse constraints
    p->nConstr = 0;
    for ( i = 0; i < p->nInps; i++ )
        for ( k = 0; pStr[k]; k++ )
            if ( pStr[k] == 'A' + i && pStr[k-1] == ';' )
            {
                assert( p->nConstr < IFN_INS*IFN_INS );
                p->pConstr[p->nConstr++] = ((int)(pStr[k] - 'A') << 16) | (int)(pStr[k+1] - 'A');
//                printf( "Added constraint (%c < %c)\n", pStr[k], pStr[k+1] );
            }
//    if ( p->nConstr )
//        printf( "Total constraints = %d\n", p->nConstr );
}